

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomvar.hpp
# Opt level: O0

void __thiscall MetaSim::RandomVar::MaxException::MaxException(MaxException *this,string *cl)

{
  string *in_RSI;
  undefined8 *in_RDI;
  string local_68 [55];
  allocator local_31;
  string *in_stack_ffffffffffffffd0;
  string *in_stack_ffffffffffffffd8;
  Exc *in_stack_ffffffffffffffe0;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffffd0,
             "Maximum value cannot be computed for this variable type",&local_31);
  std::__cxx11::string::string(local_68,in_RSI);
  Exc::Exc(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  *in_RDI = &PTR__MaxException_00235cc0;
  return;
}

Assistant:

MaxException(std::string cl)
                :Exc("Maximum value cannot be computed for this variable type", cl) {}